

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O2

void __thiscall
Function_Pool::AreaInfo::_fill
          (AreaInfo *this,uint32_t x,uint32_t y,uint32_t width_,uint32_t height_,uint32_t count,
          bool yAxis)

{
  uint32_t *puVar1;
  pointer puVar2;
  ulong __new_size;
  uint32_t *puVar3;
  pointer puVar4;
  int iVar5;
  ulong uVar6;
  uint __tmp_2;
  ulong uVar7;
  uint __tmp_3;
  uint __tmp_1;
  uint __tmp;
  
  __new_size = (ulong)count;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->startX,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->startY,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->width,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->height,__new_size);
  if (yAxis) {
    puVar1 = (this->startX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->startX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = x;
    }
    puVar1 = (this->width).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->width).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = width_;
    }
    uVar6 = (ulong)height_ % (ulong)count;
    puVar4 = (this->height).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->startY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; __new_size != uVar7; uVar7 = uVar7 + 1) {
      iVar5 = (int)uVar6;
      puVar4[uVar7] = (height_ / count + 1) - (uint)(iVar5 == 0);
      puVar2[uVar7] = y;
      uVar6 = (ulong)(iVar5 - 1);
      if (iVar5 == 0) {
        uVar6 = 0;
      }
      y = y + puVar4[uVar7];
    }
  }
  else {
    puVar1 = (this->startY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->startY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = y;
    }
    puVar2 = (this->height).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar4 = (this->height).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      *puVar4 = height_;
    }
    uVar6 = (ulong)width_ % (ulong)count;
    puVar4 = (this->startX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->width).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; __new_size != uVar7; uVar7 = uVar7 + 1) {
      iVar5 = (int)uVar6;
      puVar2[uVar7] = (width_ / count + 1) - (uint)(iVar5 == 0);
      puVar4[uVar7] = x;
      uVar6 = (ulong)(iVar5 - 1);
      if (iVar5 == 0) {
        uVar6 = 0;
      }
      x = x + puVar2[uVar7];
    }
  }
  return;
}

Assistant:

void AreaInfo::_fill( uint32_t x, uint32_t y, uint32_t width_, uint32_t height_, uint32_t count, bool yAxis )
    {
        startX.resize( count );
        startY.resize( count );
        width.resize( count );
        height.resize( count );

        if( yAxis ) { // process by rows
            std::fill( startX.begin(), startX.end(), x );
            std::fill( width.begin(), width.end(), width_ );

            uint32_t remainValue = height_ % count;
            uint32_t previousValue = y;

            for( size_t i = 0; i < count; ++i ) {
                height[i] = height_ / count;
                if( remainValue > 0 ) {
                    --remainValue;
                    ++height[i];
                }
                startY[i] = previousValue;
                previousValue = startY[i] + height[i];
            }
        }
        else { // process by columns
            std::fill( startY.begin(), startY.end(), y );
            std::fill( height.begin(), height.end(), height_ );

            uint32_t remainValue = width_ % count;
            uint32_t previousValue = x;

            for( size_t i = 0; i < count; ++i ) {
                width[i] = width_ / count;
                if( remainValue > 0 ) {
                    --remainValue;
                    ++width[i];
                }
                startX[i] = previousValue;
                previousValue = startX[i] + width[i];
            }
        }
    }